

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O0

int Ivy_ManRewritePre(Ivy_Man_t *p,int fUpdateLevel,int fUseZeroCost,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  Rwt_Man_t *p_00;
  Ivy_Obj_t *pObj;
  Dec_Graph_t *pGraph_00;
  abctime aVar6;
  abctime aVar7;
  int fCompl;
  Dec_Graph_t *pGraph;
  abctime clkStart;
  abctime clk;
  int nGain;
  int nNodes;
  int i;
  Ivy_Obj_t *pNode;
  Rwt_Man_t *pManRwt;
  int fVerbose_local;
  int fUseZeroCost_local;
  int fUpdateLevel_local;
  Ivy_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 == (Rwt_Man_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if ((fUpdateLevel != 0) && (p->fFanout == 0)) {
      Ivy_ManStartFanout(p);
    }
    if (fUpdateLevel != 0) {
      Ivy_ManRequiredLevels(p);
    }
    iVar1 = Ivy_ManObjIdMax(p);
    for (nGain = 0; iVar2 = Vec_PtrSize(p->vObjs), nGain < iVar2; nGain = nGain + 1) {
      pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nGain);
      if ((pObj != (Ivy_Obj_t *)0x0) && (iVar2 = Ivy_ObjIsNode(pObj), iVar2 != 0)) {
        Ivy_NodeFixBufferFanins(p,pObj,1);
        iVar2 = Ivy_ObjIsBuf(pObj);
        if (iVar2 == 0) {
          if (iVar1 < nGain) break;
          iVar2 = Ivy_NodeRewrite(p,p_00,pObj,fUpdateLevel,fUseZeroCost);
          if ((0 < iVar2) || ((iVar2 == 0 && (fUseZeroCost != 0)))) {
            pGraph_00 = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
            iVar3 = Rwt_ManReadCompl(p_00);
            aVar7 = Abc_Clock();
            if (iVar3 != 0) {
              Dec_GraphComplement(pGraph_00);
            }
            Ivy_GraphUpdateNetwork(p,pObj,pGraph_00,fUpdateLevel,iVar2);
            if (iVar3 != 0) {
              Dec_GraphComplement(pGraph_00);
            }
            aVar6 = Abc_Clock();
            Rwt_ManAddTimeUpdate(p_00,aVar6 - aVar7);
          }
        }
      }
    }
    aVar7 = Abc_Clock();
    Rwt_ManAddTimeTotal(p_00,aVar7 - aVar5);
    if (fVerbose != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    if (fUpdateLevel == 0) {
      Ivy_ManResetLevels(p);
    }
    else {
      Vec_IntFree(p->vRequired);
      p->vRequired = (Vec_Int_t *)0x0;
    }
    uVar4 = Ivy_ManCleanup(p);
    if (uVar4 != 0) {
      printf("Cleanup after rewriting removed %d dangling nodes.\n",(ulong)uVar4);
    }
    iVar1 = Ivy_ManCheck(p);
    if (iVar1 == 0) {
      printf("Ivy_ManRewritePre(): The check has failed.\n");
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManRewritePre( Ivy_Man_t * p, int fUpdateLevel, int fUseZeroCost, int fVerbose )
{
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( fUpdateLevel && p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Ivy_ManRequiredLevels( p );
    // set the number of levels
//    p->nLevelMax = Ivy_ManLevels( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        // fix the fanin buffer problem
        Ivy_NodeFixBufferFanins( p, pNode, 1 );
        if ( Ivy_ObjIsBuf(pNode) )
            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes )
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewrite( p, pManRwt, pNode, fUpdateLevel, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
/*
            {
                Ivy_Obj_t * pObj;
                int i;
                printf( "USING: (" );
                Vec_PtrForEachEntry( Ivy_Obj_t *, Rwt_ManReadLeaves(pManRwt), pObj, i )
                    printf( "%d ", Ivy_ObjFanoutNum(Ivy_Regular(pObj)) );
                printf( ")   Gain = %d.\n", nGain );
            }
            if ( nGain > 0 )
            { // print stats on the MFFC
                extern void Ivy_NodeMffcConeSuppPrint( Ivy_Obj_t * pNode );
                printf( "Node %6d : Gain = %4d  ", pNode->Id, nGain );
                Ivy_NodeMffcConeSuppPrint( pNode );
            }
*/
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetwork( p, pNode, pGraph, fUpdateLevel, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    if ( fUpdateLevel )
        Vec_IntFree( p->vRequired ), p->vRequired = NULL;
    else
        Ivy_ManResetLevels( p );
    // check
    if ( (i = Ivy_ManCleanup(p)) )
        printf( "Cleanup after rewriting removed %d dangling nodes.\n", i );
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}